

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# path.cc
# Opt level: O0

int tchecker::zg::path::symbolic::lexical_cmp(node_t *n1,node_t *n2)

{
  bool bVar1;
  bool bVar2;
  state_t *s1;
  state_t *s2;
  int state_cmp;
  node_t *n2_local;
  node_t *n1_local;
  
  s1 = tchecker::graph::node_zg_state_t::state(&n1->super_node_zg_state_t);
  s2 = tchecker::graph::node_zg_state_t::state(&n2->super_node_zg_state_t);
  n1_local._4_4_ = ta::lexical_cmp(&s1->super_state_t,&s2->super_state_t);
  if (n1_local._4_4_ == 0) {
    bVar1 = tchecker::graph::node_flags_t::initial(&n1->super_node_flags_t);
    bVar2 = tchecker::graph::node_flags_t::initial(&n2->super_node_flags_t);
    if (bVar1 == bVar2) {
      bVar1 = tchecker::graph::node_flags_t::final(&n1->super_node_flags_t);
      bVar2 = tchecker::graph::node_flags_t::final(&n2->super_node_flags_t);
      n1_local._4_4_ = (uint)(bVar1 < bVar2);
    }
    else {
      bVar1 = tchecker::graph::node_flags_t::initial(&n1->super_node_flags_t);
      bVar2 = tchecker::graph::node_flags_t::initial(&n2->super_node_flags_t);
      n1_local._4_4_ = (uint)(bVar1 < bVar2);
    }
  }
  return n1_local._4_4_;
}

Assistant:

int lexical_cmp(tchecker::zg::path::symbolic::node_t const & n1, tchecker::zg::path::symbolic::node_t const & n2)
{
  int state_cmp = tchecker::ta::lexical_cmp(static_cast<tchecker::ta::state_t const &>(n1.state()),
                                            static_cast<tchecker::ta::state_t const &>(n2.state()));
  if (state_cmp != 0)
    return state_cmp;
  if (n1.initial() != n2.initial())
    return n1.initial() < n2.initial();
  return n1.final() < n2.final();
}